

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameBase.h
# Opt level: O0

void __thiscall BayesianGameBase::AddProbability(BayesianGameBase *this,Index i,double p)

{
  reference pvVar1;
  uint in_ESI;
  mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>
  *in_RDI;
  double in_XMM0_Qa;
  double *in_stack_ffffffffffffffa8;
  sparse_vector_element<boost::numeric::ublas::mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
  *this_00;
  sparse_vector_element<boost::numeric::ublas::mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
  local_30 [2];
  
  if ((undefined1  [48])
      ((undefined1  [48])
       (in_RDI->data_).
       super_map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
       ._M_t._M_impl & (undefined1  [48])0x1) == (undefined1  [48])0x0) {
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        &(in_RDI->data_).
                         super_map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
                         ._M_t._M_impl.super__Rb_tree_header,(ulong)in_ESI);
    *pvVar1 = in_XMM0_Qa + *pvVar1;
  }
  else {
    this_00 = local_30;
    boost::numeric::ublas::
    mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>
    ::operator[](in_RDI,(size_type)this_00);
    boost::numeric::ublas::
    sparse_vector_element<boost::numeric::ublas::mapped_vector<double,boost::numeric::ublas::map_std<unsigned_long,double,std::allocator<std::pair<unsigned_long_const,double>>>>>
    ::operator+=(this_00,in_stack_ffffffffffffffa8);
    boost::numeric::ublas::
    sparse_vector_element<boost::numeric::ublas::mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
    ::~sparse_vector_element
              ((sparse_vector_element<boost::numeric::ublas::mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
                *)0x8b2e4c);
  }
  return;
}

Assistant:

void AddProbability(Index i, double p)
            {if(_m_useSparse) _m_jTypeProbsSparse[i]+=p;
                else _m_jTypeProbs[i]+=p;}